

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int encode_session_identifier
              (ptls_buffer_t *buf,uint32_t ticket_age_add,st_ptls_key_schedule_t *sched,
              char *server_name,uint16_t csid)

{
  int iVar1;
  uint64_t uVar2;
  size_t sVar3;
  long lVar4;
  size_t len;
  size_t sVar5;
  undefined1 local_52;
  undefined1 local_51;
  size_t local_50;
  size_t local_48;
  uint local_3c;
  ulong local_38;
  
  iVar1 = ptls_buffer__do_pushv(buf,"",2);
  if (iVar1 == 0) {
    sVar3 = buf->off;
    uVar2 = gettime_millis();
    local_38 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    iVar1 = ptls_buffer__do_pushv(buf,&local_38,8);
    if ((iVar1 == 0) && (local_48 = sVar3, iVar1 = ptls_buffer__do_pushv(buf,"",2), iVar1 == 0)) {
      sVar3 = buf->off;
      iVar1 = ptls_buffer_reserve(buf,sched->algo->digest_size);
      if ((iVar1 == 0) &&
         (local_50 = sVar3, iVar1 = derive_resumption_secret(sched,buf->base + buf->off), iVar1 == 0
         )) {
        sVar3 = buf->off + sched->algo->digest_size;
        buf->off = sVar3;
        lVar4 = sVar3 - local_50;
        buf->base[local_50 - 2] = (uint8_t)((ulong)lVar4 >> 8);
        buf->base[local_50 - 1] = (uint8_t)lVar4;
        local_52 = (undefined1)(csid >> 8);
        local_51 = (undefined1)csid;
        iVar1 = ptls_buffer__do_pushv(buf,&local_52,2);
        if (iVar1 == 0) {
          local_3c = ticket_age_add >> 0x18 | (ticket_age_add & 0xff0000) >> 8 |
                     (ticket_age_add & 0xff00) << 8 | ticket_age_add << 0x18;
          iVar1 = ptls_buffer__do_pushv(buf,&local_3c,4);
          if ((iVar1 == 0) && (iVar1 = ptls_buffer__do_pushv(buf,"",2), iVar1 == 0)) {
            sVar3 = buf->off;
            sVar5 = sVar3;
            if (server_name != (char *)0x0) {
              len = strlen(server_name);
              iVar1 = ptls_buffer__do_pushv(buf,server_name,len);
              if (iVar1 != 0) {
                return iVar1;
              }
              sVar5 = buf->off;
            }
            buf->base[sVar3 - 2] = (uint8_t)(sVar5 - sVar3 >> 8);
            buf->base[sVar3 - 1] = (uint8_t)(sVar5 - sVar3);
            lVar4 = buf->off - local_48;
            buf->base[local_48 - 2] = (uint8_t)((ulong)lVar4 >> 8);
            buf->base[local_48 - 1] = (uint8_t)lVar4;
            iVar1 = 0;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int encode_session_identifier(ptls_buffer_t *buf, uint32_t ticket_age_add, struct st_ptls_key_schedule_t *sched,
                              const char *server_name, uint16_t csid)
{
    int ret = 0;

    ptls_buffer_push_block(buf, 2, {
        /* date */
        ptls_buffer_push64(buf, gettime_millis());
        /* resumption master secret */
        ptls_buffer_push_block(buf, 2, {
            if ((ret = ptls_buffer_reserve(buf, sched->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = derive_resumption_secret(sched, buf->base + buf->off)) != 0)
                goto Exit;
            buf->off += sched->algo->digest_size;
        });
        /* cipher-suite */
        ptls_buffer_push16(buf, csid);
        /* ticket_age_add */
        ptls_buffer_push32(buf, ticket_age_add);
        /* server-name */
        ptls_buffer_push_block(buf, 2, {
            if (server_name != NULL)
                ptls_buffer_pushv(buf, server_name, strlen(server_name));
        });
    });

Exit:
    return ret;
}